

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

sunrealtype N_VMaxNorm_SensWrapper(N_Vector x)

{
  long *in_RDI;
  sunrealtype tmp;
  sunrealtype max;
  int i;
  N_Vector in_stack_ffffffffffffffe0;
  undefined8 local_18;
  undefined4 local_c;
  
  local_18 = (N_Vector)0x0;
  for (local_c = 0; local_c < *(int *)(*in_RDI + 8); local_c = local_c + 1) {
    in_stack_ffffffffffffffe0 = (N_Vector)N_VMaxNorm(in_stack_ffffffffffffffe0);
    if ((double)local_18 < (double)in_stack_ffffffffffffffe0) {
      local_18 = in_stack_ffffffffffffffe0;
    }
  }
  return (sunrealtype)local_18;
}

Assistant:

sunrealtype N_VMaxNorm_SensWrapper(N_Vector x)
{
  int i;
  sunrealtype max, tmp;

  max = ZERO;

  for (i = 0; i < NV_NVECS_SW(x); i++)
  {
    tmp = N_VMaxNorm(NV_VEC_SW(x, i));
    if (tmp > max) { max = tmp; }
  }

  return (max);
}